

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O2

Ifn_Ntk_t * Ifn_NtkParse(char *pStr)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  Ifn_Ntk_t *p;
  byte bVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  p = (Ifn_Ntk_t *)calloc(1,0x3730);
  iVar3 = Ifn_ManStrType2(pStr);
  if (iVar3 == 0) {
    iVar3 = Ifn_NtkParseInt(pStr,p);
  }
  else {
    iVar3 = Ifn_NtkParseInt2(pStr,p);
  }
  if (iVar3 == 0) {
    free(p);
    p = (Ifn_Ntk_t *)0x0;
  }
  else {
    Ifn_NtkParseConstraints(pStr,p);
    uVar1 = p->nInps;
    bVar4 = (char)uVar1 - 6;
    bVar2 = bVar4 & 0x1f;
    uVar9 = 0;
    uVar8 = (ulong)(uint)(1 << bVar2);
    if (1 << bVar2 < 1) {
      uVar8 = uVar9;
    }
    if ((int)uVar1 < 7) {
      uVar8 = 1;
      bVar4 = 0;
    }
    uVar7 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar7 = uVar9;
    }
    for (; uVar9 != uVar7; uVar9 = uVar9 + 1) {
      lVar5 = (long)((int)uVar9 << (bVar4 & 0x1f));
      if (uVar9 < 6) {
        for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
          p->pTtElems[lVar5 + uVar6] = s_Truths6[uVar9];
        }
      }
      else {
        for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
          p->pTtElems[lVar5 + uVar6] = -(ulong)((1 << ((char)uVar9 - 6U & 0x1f) & (uint)uVar6) != 0)
          ;
        }
      }
    }
  }
  return p;
}

Assistant:

Ifn_Ntk_t * Ifn_NtkParse( char * pStr )
{
    Ifn_Ntk_t * p = ABC_CALLOC( Ifn_Ntk_t, 1 );
    if ( Ifn_ManStrType2(pStr) )
    {
        if ( !Ifn_NtkParseInt2( pStr, p ) )
        {
            ABC_FREE( p );
            return NULL;
        }
    }
    else
    {
        if ( !Ifn_NtkParseInt( pStr, p ) )
        {
            ABC_FREE( p );
            return NULL;
        }
    }
    Ifn_NtkParseConstraints( pStr, p );
    Abc_TtElemInit2( p->pTtElems, p->nInps );
//    printf( "Finished parsing: " ); Ifn_NtkPrint(p);
    return p;
}